

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_static_context_tests(int use_prealloc)

{
  _func_void_char_ptr_void_ptr *p_Var1;
  void *pvVar2;
  secp256k1_context *psVar3;
  int iVar4;
  int32_t dummy;
  secp256k1_callback _saved_illegal_cb_6;
  int32_t _calls_to_illegal_callback_6;
  secp256k1_callback _saved_illegal_cb_5;
  int32_t _calls_to_illegal_callback_5;
  secp256k1_callback _saved_illegal_cb_4;
  int32_t _calls_to_illegal_callback_4;
  secp256k1_callback _saved_illegal_cb_3;
  int32_t _calls_to_illegal_callback_3;
  secp256k1_context *my_static_ctx;
  secp256k1_callback _saved_illegal_cb_2;
  int32_t _calls_to_illegal_callback_2;
  secp256k1_callback _saved_illegal_cb_1;
  int32_t _calls_to_illegal_callback_1;
  secp256k1_callback _saved_illegal_cb;
  int32_t _calls_to_illegal_callback;
  uchar seed [32];
  secp256k1_context *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  
  if (secp256k1_context_no_precomp != secp256k1_context_static) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x15f,"test condition failed: secp256k1_context_no_precomp == secp256k1_context_static"
           );
    abort();
  }
  p_Var1 = (STATIC_CTX->illegal_callback).fn;
  pvVar2 = (STATIC_CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (_func_void_char_ptr_void_ptr *)in_stack_ffffffffffffff18,(void *)0x1102e9);
  iVar4 = secp256k1_context_randomize(in_stack_ffffffffffffff18,(uchar *)0x1102fd);
  psVar3 = STATIC_CTX;
  if (iVar4 == 0) {
    (STATIC_CTX->illegal_callback).fn = p_Var1;
    (psVar3->illegal_callback).data = pvVar2;
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x165,"test condition failed: _calls_to_illegal_callback == 1");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x165,"test condition failed: (secp256k1_context_randomize(STATIC_CTX, seed)) == 0");
  abort();
}

Assistant:

static void run_static_context_tests(int use_prealloc) {
    /* Check that deprecated secp256k1_context_no_precomp is an alias to secp256k1_context_static. */
    CHECK(secp256k1_context_no_precomp == secp256k1_context_static);

    {
        unsigned char seed[32] = {0x17};

        /* Randomizing secp256k1_context_static is not supported. */
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, seed));
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, NULL));

        /* Destroying or cloning secp256k1_context_static is not supported. */
        if (use_prealloc) {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone_size(STATIC_CTX));
            {
                secp256k1_context *my_static_ctx = malloc(sizeof(*STATIC_CTX));
                CHECK(my_static_ctx != NULL);
                memset(my_static_ctx, 0x2a, sizeof(*my_static_ctx));
                CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone(STATIC_CTX, my_static_ctx));
                CHECK(all_bytes_equal(my_static_ctx, 0x2a, sizeof(*my_static_ctx)));
                free(my_static_ctx);
            }
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_preallocated_destroy(STATIC_CTX));
        } else {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_clone(STATIC_CTX));
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_destroy(STATIC_CTX));
        }
    }

    {
        /* Verify that setting and resetting illegal callback works */
        int32_t dummy = 0;
        secp256k1_context_set_illegal_callback(STATIC_CTX, counting_illegal_callback_fn, &dummy);
        CHECK(STATIC_CTX->illegal_callback.fn == counting_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == &dummy);
        secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
        CHECK(STATIC_CTX->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == NULL);
    }
}